

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int luaK_exp2const(FuncState *fs,expdesc *e,TValue *v)

{
  TString *pTVar1;
  Vardesc *pVVar2;
  byte bVar3;
  int iVar4;
  
  if (e->t != e->f) {
    return 0;
  }
  switch(e->k) {
  case VNIL:
    v->tt_ = '\0';
    break;
  case VTRUE:
    v->tt_ = '\x11';
    break;
  case VFALSE:
    v->tt_ = '\x01';
    break;
  default:
    iVar4 = tonumeral(e,v);
    return iVar4;
  case VKSTR:
    pTVar1 = (e->u).strval;
    (v->value_).gc = (GCObject *)pTVar1;
    bVar3 = pTVar1->tt | 0x40;
    goto LAB_00126246;
  case VCONST:
    iVar4 = (e->u).info;
    pVVar2 = (fs->ls->dyd->actvar).arr;
    v->value_ = pVVar2[iVar4].vd.value_;
    bVar3 = *(byte *)((long)pVVar2 + (long)iVar4 * 0x18 + 8);
LAB_00126246:
    v->tt_ = bVar3;
  }
  return 1;
}

Assistant:

int luaK_exp2const (FuncState *fs, const expdesc *e, TValue *v) {
  if (hasjumps(e))
    return 0;  /* not a constant */
  switch (e->k) {
    case VFALSE:
      setbfvalue(v);
      return 1;
    case VTRUE:
      setbtvalue(v);
      return 1;
    case VNIL:
      setnilvalue(v);
      return 1;
    case VKSTR: {
      setsvalue(fs->ls->L, v, e->u.strval);
      return 1;
    }
    case VCONST: {
      setobj(fs->ls->L, v, const2val(fs, e));
      return 1;
    }
    default: return tonumeral(e, v);
  }
}